

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fakeit.hpp
# Opt level: O3

type __thiscall
fakeit::MethodStubbingProgress<unsigned_long>::AlwaysReturn<unsigned_long>
          (MethodStubbingProgress<unsigned_long> *this,unsigned_long *r)

{
  unsigned_long local_28 [2];
  code *local_18;
  code *local_10;
  
  local_28[0] = *r;
  local_28[1] = 0;
  local_10 = std::
             _Function_handler<unsigned_long_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/MatrixManAtYrService[P]hello-cpp-linwin/externalInclude/FakeIt/single_header/boost/fakeit.hpp:7079:29)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<unsigned_long_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/MatrixManAtYrService[P]hello-cpp-linwin/externalInclude/FakeIt/single_header/boost/fakeit.hpp:7079:29)>
             ::_M_manager;
  (*this->_vptr_MethodStubbingProgress[3])();
  if (local_18 != (code *)0x0) {
    (*local_18)(local_28,local_28,3);
  }
  return;
}

Assistant:

typename std::enable_if<!std::is_reference<U>::value, void>::type
        AlwaysReturn(const R &r) {
            return AlwaysDo([r](const typename fakeit::test_arg<arglist>::type...) -> R { return r; });
        }